

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

bool __thiscall
mkvparser::Cues::Find(Cues *this,longlong time_ns,Track *pTrack,CuePoint **pCP,TrackPosition **pTP)

{
  CuePoint **ppCVar1;
  long lVar2;
  CuePoint *pCVar3;
  undefined1 auVar4 [16];
  longlong lVar5;
  TrackPosition *pTVar6;
  CuePoint **ppCVar7;
  CuePoint **ppCVar8;
  CuePoint **ppCVar9;
  CuePoint **ppCVar10;
  
  if (((pTrack != (Track *)0x0 && -1 < time_ns) &&
      (ppCVar1 = this->m_cue_points, ppCVar1 != (CuePoint **)0x0)) &&
     (lVar2 = this->m_count, lVar2 != 0)) {
    pCVar3 = *ppCVar1;
    *pCP = pCVar3;
    if (pCVar3 != (CuePoint *)0x0) {
      lVar5 = CuePoint::GetTime(pCVar3,this->m_pSegment);
      if (lVar5 < time_ns) {
        ppCVar7 = ppCVar1 + lVar2;
        ppCVar8 = ppCVar7;
        ppCVar9 = ppCVar1;
        while (ppCVar9 < ppCVar8) {
          auVar4._8_8_ = (long)ppCVar8 - (long)ppCVar9 >> 0x3f;
          auVar4._0_8_ = (long)ppCVar8 - (long)ppCVar9 >> 3;
          ppCVar10 = ppCVar9 + SUB168(auVar4 / SEXT816(2),0);
          if (ppCVar7 <= ppCVar10) {
            return false;
          }
          if (*ppCVar10 == (CuePoint *)0x0) {
            return false;
          }
          lVar5 = CuePoint::GetTime(*ppCVar10,this->m_pSegment);
          if (lVar5 <= time_ns) {
            ppCVar9 = ppCVar10 + 1;
            ppCVar10 = ppCVar8;
          }
          ppCVar8 = ppCVar10;
          if (ppCVar8 < ppCVar9) {
            return false;
          }
        }
        if (ppCVar9 <= ppCVar1) {
          return false;
        }
        if (ppCVar9 != ppCVar8) {
          return false;
        }
        if (ppCVar7 < ppCVar9) {
          return false;
        }
        pCVar3 = ppCVar8[-1];
        *pCP = pCVar3;
        if (pCVar3 == (CuePoint *)0x0) {
          return false;
        }
        lVar5 = CuePoint::GetTime(pCVar3,this->m_pSegment);
        if (time_ns < lVar5) {
          return false;
        }
        pTVar6 = CuePoint::Find(*pCP,pTrack);
      }
      else {
        pTVar6 = CuePoint::Find(*pCP,pTrack);
      }
      *pTP = pTVar6;
      return pTVar6 != (TrackPosition *)0x0;
    }
  }
  return false;
}

Assistant:

bool Cues::Find(long long time_ns, const Track* pTrack, const CuePoint*& pCP,
                const CuePoint::TrackPosition*& pTP) const {
  if (time_ns < 0 || pTrack == NULL || m_cue_points == NULL || m_count == 0)
    return false;

  CuePoint** const ii = m_cue_points;
  CuePoint** i = ii;

  CuePoint** const jj = ii + m_count;
  CuePoint** j = jj;

  pCP = *i;
  if (pCP == NULL)
    return false;

  if (time_ns <= pCP->GetTime(m_pSegment)) {
    pTP = pCP->Find(pTrack);
    return (pTP != NULL);
  }

  while (i < j) {
    // INVARIANT:
    //[ii, i) <= time_ns
    //[i, j)  ?
    //[j, jj) > time_ns

    CuePoint** const k = i + (j - i) / 2;
    if (k >= jj)
      return false;

    CuePoint* const pCP = *k;
    if (pCP == NULL)
      return false;

    const long long t = pCP->GetTime(m_pSegment);

    if (t <= time_ns)
      i = k + 1;
    else
      j = k;

    if (i > j)
      return false;
  }

  if (i != j || i > jj || i <= ii)
    return false;

  pCP = *--i;

  if (pCP == NULL || pCP->GetTime(m_pSegment) > time_ns)
    return false;

  // TODO: here and elsewhere, it's probably not correct to search
  // for the cue point with this time, and then search for a matching
  // track.  In principle, the matching track could be on some earlier
  // cue point, and with our current algorithm, we'd miss it.  To make
  // this bullet-proof, we'd need to create a secondary structure,
  // with a list of cue points that apply to a track, and then search
  // that track-based structure for a matching cue point.

  pTP = pCP->Find(pTrack);
  return (pTP != NULL);
}